

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_bounds ZSTD_cParam_getBounds(ZSTD_cParameter param)

{
  ZSTD_bounds ZVar1;
  undefined8 uStack_18;
  ZSTD_cParameter param_local;
  ZSTD_bounds bounds;
  
  uStack_18 = 0;
  bounds.error._0_4_ = 0;
  bounds.error._4_4_ = 0;
  if (param == ZSTD_c_experimentalParam2) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_compressionLevel) {
    bounds.error._0_4_ = ZSTD_minCLevel();
    bounds.error._4_4_ = ZSTD_maxCLevel();
  }
  else if (param == ZSTD_c_windowLog) {
    bounds.error._0_4_ = 10;
    bounds.error._4_4_ = 0x1f;
  }
  else if (param == ZSTD_c_hashLog) {
    bounds.error._0_4_ = 6;
    bounds.error._4_4_ = 0x1e;
  }
  else if (param == ZSTD_c_chainLog) {
    bounds.error._0_4_ = 6;
    bounds.error._4_4_ = 0x1e;
  }
  else if (param == ZSTD_c_searchLog) {
    bounds.error._0_4_ = 1;
    bounds.error._4_4_ = 0x1e;
  }
  else if (param == ZSTD_c_minMatch) {
    bounds.error._0_4_ = 3;
    bounds.error._4_4_ = 7;
  }
  else if (param == ZSTD_c_targetLength) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 0x20000;
  }
  else if (param == ZSTD_c_strategy) {
    bounds.error._0_4_ = 1;
    bounds.error._4_4_ = 9;
  }
  else if (param == ZSTD_c_enableLongDistanceMatching) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 2;
  }
  else if (param == ZSTD_c_ldmHashLog) {
    bounds.error._0_4_ = 6;
    bounds.error._4_4_ = 0x1e;
  }
  else if (param == ZSTD_c_ldmMinMatch) {
    bounds.error._0_4_ = 4;
    bounds.error._4_4_ = 0x1000;
  }
  else if (param == ZSTD_c_ldmBucketSizeLog) {
    bounds.error._0_4_ = 1;
    bounds.error._4_4_ = 8;
  }
  else if (param == ZSTD_c_ldmHashRateLog) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 0x19;
  }
  else if (param == ZSTD_c_contentSizeFlag) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_checksumFlag) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_dictIDFlag) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_nbWorkers) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 0;
  }
  else if (param == ZSTD_c_jobSize) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 0;
  }
  else if (param == ZSTD_c_overlapLog) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 0;
  }
  else if (param == ZSTD_c_experimentalParam1) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_experimentalParam3) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_experimentalParam4) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 3;
  }
  else if (param == ZSTD_c_experimentalParam5) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 2;
  }
  else if (param == ZSTD_c_experimentalParam6) {
    bounds.error._0_4_ = 0x40;
    bounds.error._4_4_ = 0x20000;
  }
  else if (param == ZSTD_c_experimentalParam7) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 0x7fffffff;
  }
  else if (param == ZSTD_c_experimentalParam8) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param - ZSTD_c_experimentalParam9 < 2) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_experimentalParam11) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_experimentalParam12) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_experimentalParam13) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 2;
  }
  else if (param == ZSTD_c_experimentalParam14) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 2;
  }
  else if (param == ZSTD_c_experimentalParam15) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_experimentalParam16) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 2;
  }
  else if (param == ZSTD_c_experimentalParam17) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 1;
  }
  else if (param == ZSTD_c_experimentalParam18) {
    bounds.error._0_4_ = 0x400;
    bounds.error._4_4_ = 0x20000;
  }
  else if (param == ZSTD_c_experimentalParam19) {
    bounds.error._0_4_ = 0;
    bounds.error._4_4_ = 2;
  }
  else {
    uStack_18 = 0xffffffffffffffd8;
  }
  ZVar1.lowerBound = (int)bounds.error;
  ZVar1.error = uStack_18;
  ZVar1.upperBound = bounds.error._4_4_;
  return ZVar1;
}

Assistant:

ZSTD_bounds ZSTD_cParam_getBounds(ZSTD_cParameter param)
{
    ZSTD_bounds bounds = { 0, 0, 0 };

    switch(param)
    {
    case ZSTD_c_compressionLevel:
        bounds.lowerBound = ZSTD_minCLevel();
        bounds.upperBound = ZSTD_maxCLevel();
        return bounds;

    case ZSTD_c_windowLog:
        bounds.lowerBound = ZSTD_WINDOWLOG_MIN;
        bounds.upperBound = ZSTD_WINDOWLOG_MAX;
        return bounds;

    case ZSTD_c_hashLog:
        bounds.lowerBound = ZSTD_HASHLOG_MIN;
        bounds.upperBound = ZSTD_HASHLOG_MAX;
        return bounds;

    case ZSTD_c_chainLog:
        bounds.lowerBound = ZSTD_CHAINLOG_MIN;
        bounds.upperBound = ZSTD_CHAINLOG_MAX;
        return bounds;

    case ZSTD_c_searchLog:
        bounds.lowerBound = ZSTD_SEARCHLOG_MIN;
        bounds.upperBound = ZSTD_SEARCHLOG_MAX;
        return bounds;

    case ZSTD_c_minMatch:
        bounds.lowerBound = ZSTD_MINMATCH_MIN;
        bounds.upperBound = ZSTD_MINMATCH_MAX;
        return bounds;

    case ZSTD_c_targetLength:
        bounds.lowerBound = ZSTD_TARGETLENGTH_MIN;
        bounds.upperBound = ZSTD_TARGETLENGTH_MAX;
        return bounds;

    case ZSTD_c_strategy:
        bounds.lowerBound = ZSTD_STRATEGY_MIN;
        bounds.upperBound = ZSTD_STRATEGY_MAX;
        return bounds;

    case ZSTD_c_contentSizeFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_checksumFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_dictIDFlag:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_nbWorkers:
        bounds.lowerBound = 0;
#ifdef ZSTD_MULTITHREAD
        bounds.upperBound = ZSTDMT_NBWORKERS_MAX;
#else
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_jobSize:
        bounds.lowerBound = 0;
#ifdef ZSTD_MULTITHREAD
        bounds.upperBound = ZSTDMT_JOBSIZE_MAX;
#else
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_overlapLog:
#ifdef ZSTD_MULTITHREAD
        bounds.lowerBound = ZSTD_OVERLAPLOG_MIN;
        bounds.upperBound = ZSTD_OVERLAPLOG_MAX;
#else
        bounds.lowerBound = 0;
        bounds.upperBound = 0;
#endif
        return bounds;

    case ZSTD_c_enableDedicatedDictSearch:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_enableLongDistanceMatching:
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    case ZSTD_c_ldmHashLog:
        bounds.lowerBound = ZSTD_LDM_HASHLOG_MIN;
        bounds.upperBound = ZSTD_LDM_HASHLOG_MAX;
        return bounds;

    case ZSTD_c_ldmMinMatch:
        bounds.lowerBound = ZSTD_LDM_MINMATCH_MIN;
        bounds.upperBound = ZSTD_LDM_MINMATCH_MAX;
        return bounds;

    case ZSTD_c_ldmBucketSizeLog:
        bounds.lowerBound = ZSTD_LDM_BUCKETSIZELOG_MIN;
        bounds.upperBound = ZSTD_LDM_BUCKETSIZELOG_MAX;
        return bounds;

    case ZSTD_c_ldmHashRateLog:
        bounds.lowerBound = ZSTD_LDM_HASHRATELOG_MIN;
        bounds.upperBound = ZSTD_LDM_HASHRATELOG_MAX;
        return bounds;

    /* experimental parameters */
    case ZSTD_c_rsyncable:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_forceMaxWindow :
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_format:
        ZSTD_STATIC_ASSERT(ZSTD_f_zstd1 < ZSTD_f_zstd1_magicless);
        bounds.lowerBound = ZSTD_f_zstd1;
        bounds.upperBound = ZSTD_f_zstd1_magicless;   /* note : how to ensure at compile time that this is the highest value enum ? */
        return bounds;

    case ZSTD_c_forceAttachDict:
        ZSTD_STATIC_ASSERT(ZSTD_dictDefaultAttach < ZSTD_dictForceLoad);
        bounds.lowerBound = ZSTD_dictDefaultAttach;
        bounds.upperBound = ZSTD_dictForceLoad;       /* note : how to ensure at compile time that this is the highest value enum ? */
        return bounds;

    case ZSTD_c_literalCompressionMode:
        ZSTD_STATIC_ASSERT(ZSTD_ps_auto < ZSTD_ps_enable && ZSTD_ps_enable < ZSTD_ps_disable);
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    case ZSTD_c_targetCBlockSize:
        bounds.lowerBound = ZSTD_TARGETCBLOCKSIZE_MIN;
        bounds.upperBound = ZSTD_TARGETCBLOCKSIZE_MAX;
        return bounds;

    case ZSTD_c_srcSizeHint:
        bounds.lowerBound = ZSTD_SRCSIZEHINT_MIN;
        bounds.upperBound = ZSTD_SRCSIZEHINT_MAX;
        return bounds;

    case ZSTD_c_stableInBuffer:
    case ZSTD_c_stableOutBuffer:
        bounds.lowerBound = (int)ZSTD_bm_buffered;
        bounds.upperBound = (int)ZSTD_bm_stable;
        return bounds;

    case ZSTD_c_blockDelimiters:
        bounds.lowerBound = (int)ZSTD_sf_noBlockDelimiters;
        bounds.upperBound = (int)ZSTD_sf_explicitBlockDelimiters;
        return bounds;

    case ZSTD_c_validateSequences:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_useBlockSplitter:
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    case ZSTD_c_useRowMatchFinder:
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    case ZSTD_c_deterministicRefPrefix:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_prefetchCDictTables:
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    case ZSTD_c_enableSeqProducerFallback:
        bounds.lowerBound = 0;
        bounds.upperBound = 1;
        return bounds;

    case ZSTD_c_maxBlockSize:
        bounds.lowerBound = ZSTD_BLOCKSIZE_MAX_MIN;
        bounds.upperBound = ZSTD_BLOCKSIZE_MAX;
        return bounds;

    case ZSTD_c_searchForExternalRepcodes:
        bounds.lowerBound = (int)ZSTD_ps_auto;
        bounds.upperBound = (int)ZSTD_ps_disable;
        return bounds;

    default:
        bounds.error = ERROR(parameter_unsupported);
        return bounds;
    }
}